

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<myEmployee>
          (ChArchiveOut *this,ChNameValue<std::shared_ptr<myEmployee>_> *bVal)

{
  element_type *mvalp;
  bool bVar1;
  __shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar2;
  char *mname;
  char *pcVar3;
  undefined1 local_a8 [8];
  ChValueSpecific<myEmployee> specVal;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_68;
  element_type *local_60;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_58;
  mapped_type local_50;
  size_t ext_ID;
  size_t obj_ID;
  _Node_iterator_base<void_*,_false> _Stack_38;
  bool already_stored;
  element_type *local_30;
  _Node_iterator_base<void_*,_false> local_28;
  element_type *local_20;
  myEmployee *mptr;
  ChNameValue<std::shared_ptr<myEmployee>_> *bVal_local;
  ChArchiveOut *this_local;
  
  mptr = (myEmployee *)bVal;
  bVal_local = (ChNameValue<std::shared_ptr<myEmployee>_> *)this;
  this_00 = &ChNameValue<std::shared_ptr<myEmployee>_>::value(bVal)->
             super___shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>;
  local_20 = std::__shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  if ((this->cut_all_pointers & 1U) != 0) {
    local_20 = (element_type *)0x0;
  }
  local_30 = local_20;
  local_28._M_cur =
       (__node_type *)
       std::unordered_set<void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<void_*>_>
       ::find(&this->cut_pointers,&local_30);
  _Stack_38._M_cur =
       (__node_type *)
       std::unordered_set<void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<void_*>_>
       ::end(&this->cut_pointers);
  bVar1 = std::__detail::operator!=(&local_28,&stack0xffffffffffffffc8);
  if (bVar1) {
    local_20 = (element_type *)0x0;
  }
  obj_ID._7_1_ = 0;
  ext_ID = 0;
  local_50 = 0;
  local_60 = local_20;
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::find(&this->external_ptr_id,&local_60);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::end(&this->external_ptr_id);
  bVar1 = std::__detail::operator!=(&local_58,&local_68);
  if (bVar1) {
    obj_ID._7_1_ = 1;
    specVal._ptr_to_val = local_20;
    pmVar2 = std::
             unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::operator[](&this->external_ptr_id,&specVal._ptr_to_val);
    local_50 = *pmVar2;
  }
  else {
    PutPointer(this,local_20,(bool *)((long)&obj_ID + 7),&ext_ID);
  }
  mvalp = local_20;
  mname = ChNameValue<std::shared_ptr<myEmployee>_>::name(bVal);
  pcVar3 = ChNameValue<std::shared_ptr<myEmployee>_>::flags(bVal);
  ChValueSpecific<myEmployee>::ChValueSpecific
            ((ChValueSpecific<myEmployee> *)local_a8,mvalp,mname,*pcVar3);
  (*(this->super_ChArchive)._vptr_ChArchive[0xd])
            (this,(ChValueSpecific<myEmployee> *)local_a8,(ulong)(obj_ID._7_1_ & 1),ext_ID,local_50)
  ;
  ChValueSpecific<myEmployee>::~ChValueSpecific((ChValueSpecific<myEmployee> *)local_a8);
  return;
}

Assistant:

void out     (ChNameValue< std::shared_ptr<T> > bVal) {
          
          T* mptr = bVal.value().get();

          if (this->cut_all_pointers)
              mptr = 0;
          if (this->cut_pointers.find((void*)mptr) != this->cut_pointers.end())
              mptr = 0;
          bool already_stored = false;  
          size_t obj_ID = 0; 
          size_t ext_ID = 0;
          if (this->external_ptr_id.find(static_cast<void*>(mptr)) != this->external_ptr_id.end()) {
              already_stored = true;
              ext_ID = external_ptr_id[static_cast<void*>(mptr)];
          }
          else {
              PutPointer(mptr, already_stored, obj_ID);
          }
          ChValueSpecific< T > specVal(*mptr, bVal.name(), bVal.flags());
          this->out_ref( 
              specVal,
              already_stored, 
              obj_ID,
              ext_ID); // note, this class name is not platform independent
      }